

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O0

uint crc_calc(uchar *data,int len)

{
  int local_1c;
  uint local_18;
  int i;
  uint crc;
  int len_local;
  uchar *data_local;
  
  local_18 = 0;
  _crc = data;
  for (local_1c = 0; local_1c < len; local_1c = local_1c + 1) {
    local_18 = local_18 << 8 ^ crc_table[(int)(local_18 >> 0x10 & 0xff ^ (uint)*_crc)];
    _crc = _crc + 1;
  }
  return local_18 & 0xffffff;
}

Assistant:

unsigned int
crc_calc(unsigned char *data, int len)
{
	unsigned int crc = 0;
	int i;

	for (i = 0; i < len; i++)
		crc = (crc << 8) ^ crc_table[(unsigned char)(crc >> 16) ^ *data++];

	/* ok */
	return (crc & 0xFFFFFF);
}